

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QString * __thiscall QPlainTextEdit::anchorAt(QPlainTextEdit *this,QPoint *pos)

{
  QPlainTextEditControl *pQVar1;
  int iVar2;
  QPlainTextEditPrivate *pQVar3;
  QTextDocumentPrivate *this_00;
  QTextFormatCollection *this_01;
  QTextFormatCollection *in_RSI;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal ypos;
  QTextDocumentPrivate *pieceTable;
  int cursorPos;
  QPlainTextEditPrivate *d;
  QTextCharFormat fmt;
  FragmentIterator it;
  QPoint *in_stack_ffffffffffffff48;
  QPlainTextEditPrivate *p1;
  QPointF local_58 [2];
  QPointF local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  pQVar3 = d_func((QPlainTextEdit *)0x6c0ea7);
  pQVar1 = pQVar3->control;
  QPointF::QPointF((QPointF *)in_RDI,in_stack_ffffffffffffff48);
  iVar2 = QPlainTextEditPrivate::horizontalOffset(in_RDI);
  ypos = QPlainTextEditPrivate::verticalOffset(in_RDI);
  QPointF::QPointF(local_58,(double)iVar2,ypos);
  local_38 = ::operator+((QPointF *)p1,(QPointF *)in_RDI);
  iVar2 = (**(code **)(*(long *)&pQVar1->super_QWidgetTextControl + 0x78))(pQVar1,&local_38,0);
  if (iVar2 < 0) {
    QString::QString((QString *)0x6c0f48);
  }
  else {
    document((QPlainTextEdit *)in_RDI);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    this_00 = QTextDocumentPrivate::get((QTextDocument *)0x6c0f5f);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::find((QTextDocumentPrivate *)p1,iVar2);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    this_01 = QTextDocumentPrivate::formatCollection(this_00);
    QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x6c0fd1);
    QTextFormatCollection::charFormat(in_RSI,(int)((ulong)p1 >> 0x20));
    QTextCharFormat::anchorHref((QTextCharFormat *)this_01);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6c1004);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)p1;
  }
  __stack_chk_fail();
}

Assistant:

QString QPlainTextEdit::anchorAt(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    int cursorPos = d->control->hitTest(pos + QPointF(d->horizontalOffset(),
                                                     d->verticalOffset()),
                                        Qt::ExactHit);
    if (cursorPos < 0)
        return QString();

    QTextDocumentPrivate *pieceTable = QTextDocumentPrivate::get(document());
    QTextDocumentPrivate::FragmentIterator it = pieceTable->find(cursorPos);
    QTextCharFormat fmt = pieceTable->formatCollection()->charFormat(it->format);
    return fmt.anchorHref();
}